

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O1

string * google::protobuf::compiler::csharp::TryRemovePrefix
                   (string *__return_storage_ptr__,string *prefix,string *value)

{
  char cVar1;
  size_type sVar2;
  size_type sVar3;
  ulong uVar4;
  ulong uVar5;
  pointer pcVar6;
  char cVar7;
  bool bVar8;
  bool bVar9;
  string prefix_to_match;
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  if (prefix->_M_string_length != 0) {
    uVar5 = 0;
    do {
      if ((prefix->_M_dataplus)._M_p[uVar5] != '_') {
        std::__cxx11::string::push_back((char)&local_50);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < prefix->_M_string_length);
  }
  bVar8 = local_48 != 0;
  if (local_48 == 0) {
    sVar3 = 0;
LAB_002127a5:
    uVar5 = value->_M_string_length;
    uVar4 = sVar3;
    if (sVar3 < uVar5) {
      do {
        uVar4 = sVar3;
        if ((value->_M_dataplus)._M_p[sVar3] != '_') break;
        sVar3 = sVar3 + 1;
        uVar4 = uVar5;
      } while (uVar5 != sVar3);
    }
    if (uVar4 != uVar5) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)value);
      goto LAB_002127f3;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = (value->_M_dataplus)._M_p;
  }
  else {
    sVar2 = value->_M_string_length;
    if (sVar2 != 0) {
      pcVar6 = (value->_M_dataplus)._M_p;
      uVar5 = 0;
      sVar3 = 1;
      do {
        cVar1 = pcVar6[sVar3 - 1];
        if (cVar1 != '_') {
          cVar7 = cVar1 + ' ';
          if (0x19 < (byte)(cVar1 + 0xbfU)) {
            cVar7 = cVar1;
          }
          if (cVar7 != *(char *)((long)local_50 + uVar5)) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)__return_storage_ptr__,pcVar6,pcVar6 + sVar2);
            goto LAB_002127f3;
          }
          uVar5 = uVar5 + 1;
        }
        bVar8 = uVar5 < local_48;
        if (!bVar8) goto LAB_002127a5;
        bVar9 = sVar3 != sVar2;
        sVar3 = sVar3 + 1;
      } while (bVar9);
    }
    sVar3 = sVar2;
    if (!bVar8) goto LAB_002127a5;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = (value->_M_dataplus)._M_p;
    uVar5 = value->_M_string_length;
  }
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar6,pcVar6 + uVar5);
LAB_002127f3:
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TryRemovePrefix(const std::string& prefix, const std::string& value) {
  // First normalize to a lower-case no-underscores prefix to match against
  std::string prefix_to_match = "";
  for (size_t i = 0; i < prefix.size(); i++) {
    if (prefix[i] != '_') {
      prefix_to_match += ascii_tolower(prefix[i]);
    }
  }
  
  // This keeps track of how much of value we've consumed
  size_t prefix_index, value_index;
  for (prefix_index = 0, value_index = 0;
      prefix_index < prefix_to_match.size() && value_index < value.size();
      value_index++) {
    // Skip over underscores in the value
    if (value[value_index] == '_') {
      continue;
    }
    if (ascii_tolower(value[value_index]) != prefix_to_match[prefix_index++]) {
      // Failed to match the prefix - bail out early.
      return value;
    }
  }

  // If we didn't finish looking through the prefix, we can't strip it.
  if (prefix_index < prefix_to_match.size()) {
    return value;
  }

  // Step over any underscores after the prefix
  while (value_index < value.size() && value[value_index] == '_') {
    value_index++;
  }

  // If there's nothing left (e.g. it was a prefix with only underscores afterwards), don't strip.
  if (value_index == value.size()) {
    return value;
  }

  return value.substr(value_index);
}